

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void entity_move(entity *e,void *w,vec3 *delta_pos)

{
  vec3 *pvVar1;
  float *pfVar2;
  float *pfVar3;
  block_id block;
  int iVar4;
  vec3 *pvVar5;
  vec3 *pvVar6;
  int x;
  int y;
  int axis;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  vec3 block_position;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  vec3 local_74;
  float local_68;
  vec3 *local_58;
  world *local_50;
  float local_48;
  
  pvVar1 = &(e->box).max;
  pfVar2 = &(e->box).max.y;
  local_58 = (vec3 *)&delta_pos->y;
  iVar7 = 0;
  local_50 = (world *)w;
  do {
    fVar10 = (e->box).max.y;
    local_a8._0_4_ = fVar10;
    fVar8 = roundf((e->box).min.y);
    fVar9 = (float)(int)(fVar8 + -1.0);
    fVar10 = roundf(fVar10);
    if (fVar9 <= fVar10 + 1.0) {
      y = (int)(fVar8 + -1.0);
      do {
        fVar10 = (e->box).max.x;
        local_68 = roundf((e->box).min.x);
        local_68 = local_68 + -1.0;
        fVar8 = (float)(int)local_68;
        fVar10 = roundf(fVar10);
        if (fVar8 <= fVar10 + 1.0) {
          x = (int)local_68;
          do {
            local_68 = (e->box).max.z;
            local_48 = roundf((e->box).min.z);
            local_48 = local_48 + -1.0;
            iVar11 = (int)local_48;
            local_a8._4_4_ = (float)(int)extraout_XMM0_Db;
            local_a8._0_4_ = (float)iVar11;
            fStack_a0 = (float)(int)extraout_XMM0_Dc;
            fStack_9c = (float)(int)extraout_XMM0_Dd;
            fVar10 = roundf(local_68);
            if ((float)iVar11 <= fVar10 + 1.0) {
              iVar11 = (int)local_48;
              do {
                block = world_get_block(local_50,x,y,iVar11);
                iVar4 = block_is_obstacle(block);
                if (iVar4 != 0) {
                  local_74.z = (float)local_a8._0_4_;
                  local_74.x = fVar8;
                  local_74.y = fVar9 + -0.5;
                  bounding_box_update(&block_box,&local_74);
                  if (iVar7 == 1) {
                    pfVar3 = &(e->box).min.z;
                    if ((((*pfVar3 <= block_box.max.z && block_box.max.z != *pfVar3) &&
                         (block_box.min.z < (e->box).max.z)) &&
                        (pfVar3 = &(e->box).min.y,
                        *pfVar3 <= block_box.max.y && block_box.max.y != *pfVar3)) &&
                       (block_box.min.y < *pfVar2)) {
                      if (0.0 < delta_pos->x) {
                        if ((pvVar1->x <= block_box.min.x) &&
                           (fVar10 = block_box.min.x - pvVar1->x, fVar10 < delta_pos->x)) {
                          delta_pos->x = fVar10;
                        }
                      }
                      if (delta_pos->x < 0.0) {
                        fVar10 = (e->box).min.x;
                        if ((block_box.max.x <= fVar10) &&
                           (fVar10 = block_box.max.x - fVar10, delta_pos->x < fVar10)) {
                          delta_pos->x = fVar10;
                        }
                      }
                    }
                  }
                  else if (iVar7 == 0) {
                    pfVar3 = &(e->box).min.z;
                    if ((((*pfVar3 <= block_box.max.z && block_box.max.z != *pfVar3) &&
                         (block_box.min.z < (e->box).max.z)) &&
                        (pvVar5 = &(e->box).min,
                        pvVar5->x <= block_box.max.x && block_box.max.x != pvVar5->x)) &&
                       (block_box.min.x < pvVar1->x)) {
                      if (0.0 < delta_pos->y) {
                        if ((*pfVar2 <= block_box.min.y) &&
                           (fVar10 = block_box.min.y - *pfVar2, fVar10 < delta_pos->y)) {
                          delta_pos->y = fVar10;
                        }
                      }
                      if (delta_pos->y < 0.0) {
                        fVar10 = (e->box).min.y;
                        if ((block_box.max.y <= fVar10) &&
                           (fVar10 = block_box.max.y - fVar10, delta_pos->y < fVar10)) {
                          delta_pos->y = fVar10;
                        }
                      }
                    }
                  }
                  else {
                    pvVar5 = &(e->box).min;
                    if ((((pvVar5->x <= block_box.max.x && block_box.max.x != pvVar5->x) &&
                         (block_box.min.x < pvVar1->x)) &&
                        (pfVar3 = &(e->box).min.y,
                        *pfVar3 <= block_box.max.y && block_box.max.y != *pfVar3)) &&
                       (block_box.min.y < *pfVar2)) {
                      if (0.0 < delta_pos->z) {
                        fVar10 = (e->box).max.z;
                        if ((fVar10 <= block_box.min.z) &&
                           (fVar10 = block_box.min.z - fVar10, fVar10 < delta_pos->z)) {
                          delta_pos->z = fVar10;
                        }
                      }
                      if (delta_pos->z < 0.0) {
                        fVar10 = (e->box).min.z;
                        if ((block_box.max.z <= fVar10) &&
                           (fVar10 = block_box.max.z - fVar10, delta_pos->z < fVar10)) {
                          delta_pos->z = fVar10;
                        }
                      }
                    }
                  }
                }
                iVar11 = iVar11 + 1;
                _local_a8 = ZEXT416((uint)(float)iVar11);
                fVar10 = roundf((e->box).max.z);
              } while ((float)iVar11 <= fVar10 + 1.0);
            }
            x = x + 1;
            fVar8 = (float)x;
            fVar10 = roundf(pvVar1->x);
          } while (fVar8 <= fVar10 + 1.0);
        }
        y = y + 1;
        fVar9 = (float)y;
        local_a8._0_4_ = *pfVar2;
        fVar10 = roundf(*pfVar2);
      } while (fVar9 <= fVar10 + 1.0);
    }
    if (iVar7 == 0) {
      (e->box).min.y = local_58->x + (e->box).min.y;
      pvVar5 = local_58;
      pvVar6 = (vec3 *)pfVar2;
      fVar10 = (float)local_a8._0_4_;
LAB_001088ba:
      pvVar6->x = fVar10 + pvVar5->x;
    }
    else if (iVar7 == 1) {
      (e->box).min.x = delta_pos->x + (e->box).min.x;
      pvVar5 = pvVar1;
      pvVar6 = pvVar1;
      fVar10 = delta_pos->x;
      goto LAB_001088ba;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 3) {
      add_v3(&e->position,&e->position,delta_pos);
      return;
    }
  } while( true );
}

Assistant:

void entity_move(entity *e, void *w, vec3 *delta_pos)
{
    for (int axis = 0; axis < 3; axis++)
    {
        for (int y = roundf(e->box.min.y) - 1; y <= roundf(e->box.max.y) + 1; y++)
        {
            for (int x = roundf(e->box.min.x) - 1; x <= roundf(e->box.max.x) + 1; x++)
            {
                for (int z = roundf(e->box.min.z) - 1; z <= roundf(e->box.max.z) + 1; z++)
                {
                    if (!block_is_obstacle(world_get_block(w, x, y, z)))
                        continue;

                    vec3 block_position = {x, y - 0.5f, z};
                    bounding_box_update(&block_box, &block_position);

                    if (axis == 0)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x)
                        {
                            if (delta_pos->y > 0.0f && e->box.max.y <= block_box.min.y)
                            {
                                float difference = block_box.min.y - e->box.max.y;
                                if (difference < delta_pos->y)
                                    delta_pos->y = difference;
                            }
                            if (delta_pos->y < 0.0f && e->box.min.y >= block_box.max.y)
                            {
                                float difference = block_box.max.y - e->box.min.y;
                                if (difference > delta_pos->y)
                                    delta_pos->y = difference;
                            }
                        }
                    }
                    else if (axis == 1)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->x > 0.0f && e->box.max.x <= block_box.min.x)
                            {
                                float difference = block_box.min.x - e->box.max.x;
                                if (difference < delta_pos->x)
                                    delta_pos->x = difference;
                            }
                            if (delta_pos->x < 0.0f && e->box.min.x >= block_box.max.x)
                            {
                                float difference = block_box.max.x - e->box.min.x;
                                if (difference > delta_pos->x)
                                    delta_pos->x = difference;
                            }
                        }
                    }
                    else
                    {
                        if (e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->z > 0.0f && e->box.max.z <= block_box.min.z)
                            {
                                float difference = block_box.min.z - e->box.max.z;
                                if (difference < delta_pos->z)
                                    delta_pos->z = difference;
                            }
                            if (delta_pos->z < 0.0f && e->box.min.z >= block_box.max.z)
                            {
                                float difference = block_box.max.z - e->box.min.z;
                                if (difference > delta_pos->z)
                                    delta_pos->z = difference;
                            }
                        }
                    }
                }
            }
        }
        if (axis == 0)
        {
            e->box.min.y += delta_pos->y;
            e->box.max.y += delta_pos->y;
        }
        else if (axis == 1)
        {
            e->box.min.x += delta_pos->x;
            e->box.max.x += delta_pos->x;
        }
    }

    add_v3(&e->position, &e->position, delta_pos);
}